

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O3

bool __thiscall llbuild::basic::FileInfo::isMissing(FileInfo *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = false;
  bVar2 = false;
  if ((((this->device == 0) && (bVar2 = bVar1, this->inode == 0)) && (this->mode == 0)) &&
     ((this->size == 0 && ((this->modTime).seconds == 0)))) {
    bVar2 = (this->modTime).nanoseconds == 0;
  }
  return bVar2;
}

Assistant:

bool isMissing() const {
    // We use an all-zero FileInfo as a sentinel, under the assumption this can
    // never exist in normal circumstances.
    return (device == 0 && inode == 0 && mode == 0 && size == 0 &&
            modTime.seconds == 0 && modTime.nanoseconds == 0);
  }